

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcCircleProfileDef::~IfcCircleProfileDef(IfcCircleProfileDef *this)

{
  ~IfcCircleProfileDef(this);
  operator_delete(this,0xa0);
  return;
}

Assistant:

IfcCircleProfileDef() : Object("IfcCircleProfileDef") {}